

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_distance_vec4(ShaderEvalContext *c)

{
  float *pfVar1;
  float fVar2;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_20,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::swizzle(&local_30,(int)local_10 + 0x40,3,2,1);
  fVar2 = tcu::distance<float,4>(&local_20,&local_30);
  pfVar1 = tcu::Vector<float,_4>::x(&local_10->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }